

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

QWidgetEffectSourcePrivate * __thiscall
QWidgetEffectSourcePrivate::pixmap
          (QWidgetEffectSourcePrivate *this,CoordinateSystem system,QPoint *offset,
          PixmapPadMode mode)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long *plVar3;
  QWidget *this_00;
  int iVar4;
  uint uVar5;
  QPoint *pQVar6;
  long lVar7;
  ulong uVar8;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  long lVar9;
  ulong uVar10;
  int in_R8D;
  long in_FS_OFFSET;
  double dVar11;
  double dVar12;
  double dVar13;
  int iVar17;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  QPoint pixmapOffset;
  undefined1 local_88 [16];
  undefined1 local_78 [24];
  QPoint local_60;
  QRectF local_58;
  long local_38;
  
  lVar9 = CONCAT44(in_register_00000034,system);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(lVar9 + 0x98) == 0 && (int)offset == 0) {
    pixmap();
  }
  else {
    local_60.xp.m_i = 0;
    local_60.yp.m_i = 0;
    lVar7 = *(long *)(*(long *)(lVar9 + 0x90) + 0x20);
    local_88 = (undefined1  [16])0x0;
    uVar1 = *(undefined8 *)(lVar7 + 0x1c);
    uVar2 = *(undefined8 *)(lVar7 + 0x14);
    iVar17 = (int)uVar1 - (int)uVar2;
    auVar16._4_4_ = (int)((ulong)uVar1 >> 0x20) - (int)((ulong)uVar2 >> 0x20);
    auVar16._8_4_ = auVar16._4_4_;
    auVar16._12_4_ = -(uint)(auVar16._4_4_ < 0);
    dVar11 = (double)(auVar16._8_8_ + 1);
    local_78._8_4_ = SUB84(dVar11,0);
    local_78._0_8_ = (double)(CONCAT44(-(uint)(iVar17 < 0),iVar17) + 1);
    local_78._12_4_ = (int)((ulong)dVar11 >> 0x20);
    if ((int)offset == 0) {
      pQVar6 = (QPoint *)QPainter::worldTransform();
      QTransform::mapRect(&local_58);
      local_78._8_8_ = local_58.h;
      local_78._0_8_ = local_58.w;
      local_88._0_8_ = local_58.xp;
      local_88._8_8_ = local_58.yp;
      local_60 = (QPoint)QTransform::map(pQVar6);
    }
    if (in_R8D == 1) {
      local_58.yp._0_4_ = SUB84((double)local_88._8_8_ + -1.0,0);
      local_58.xp = (double)local_88._0_8_ + -1.0;
      local_58.yp._4_4_ = (int)((ulong)((double)local_88._8_8_ + -1.0) >> 0x20);
      local_58.w = (double)local_78._0_8_ + 1.0 + 1.0;
      local_58.h = (double)local_78._8_8_ + 1.0 + 1.0;
    }
    else if (in_R8D == 2) {
      plVar3 = *(long **)(*(long *)(*(long *)(lVar9 + 0x90) + 8) + 200);
      (**(code **)(*plVar3 + 0x60))(&local_58,plVar3,local_88);
    }
    auVar16 = QRectF::toAlignedRect();
    if ((undefined8 *)CONCAT44(in_register_0000000c,mode) != (undefined8 *)0x0) {
      *(undefined8 *)CONCAT44(in_register_0000000c,mode) = auVar16._0_8_;
    }
    local_60.yp.m_i = local_60.yp.m_i - auVar16._4_4_;
    local_60.xp.m_i = local_60.xp.m_i - auVar16._0_4_;
    lVar7 = QPainter::device();
    if (lVar7 == 0) {
      pixmap();
      dVar11 = 1.0;
    }
    else {
      dVar11 = (double)QPaintDevice::devicePixelRatio();
    }
    *(undefined1 **)&(this->super_QGraphicsEffectSourcePrivate).field_0x10 = &DAT_aaaaaaaaaaaaaaaa;
    iVar4 = (auVar16._8_4_ - auVar16._0_4_) + 1;
    dVar12 = dVar11 * (double)((auVar16._12_4_ - auVar16._4_4_) + 1);
    dVar13 = dVar11 * (double)iVar4;
    auVar14._0_8_ = (double)((ulong)dVar12 & 0x8000000000000000 | 0x3fe0000000000000) + dVar12;
    auVar14._8_8_ = (double)((ulong)dVar13 & 0x8000000000000000 | 0x3fe0000000000000) + dVar13;
    auVar16 = minpd(_DAT_0066f5d0,auVar14);
    auVar15._8_8_ = -(ulong)(-2147483648.0 < auVar16._8_8_);
    auVar15._0_8_ = -(ulong)(-2147483648.0 < auVar16._0_8_);
    uVar5 = movmskpd(iVar4,auVar15);
    uVar10 = 0x8000000000000000;
    if ((uVar5 & 1) != 0) {
      uVar10 = (ulong)(uint)(int)auVar16._0_8_ << 0x20;
    }
    uVar8 = 0x80000000;
    if ((uVar5 & 2) != 0) {
      uVar8 = (ulong)(uint)(int)auVar16._8_8_;
    }
    *(undefined1 **)&this->super_QGraphicsEffectSourcePrivate = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&(this->super_QGraphicsEffectSourcePrivate).field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
    local_58.xp = (qreal)(uVar8 | uVar10);
    QPixmap::QPixmap((QPixmap *)this,(QSize *)&local_58);
    QPixmap::setDevicePixelRatio(dVar11);
    QColor::QColor((QColor *)&local_58,transparent);
    QPixmap::fill((QColor *)this);
    this_00 = *(QWidget **)(lVar9 + 0x90);
    QRegion::QRegion((QRegion *)&local_58);
    QWidget::render(this_00,(QPaintDevice *)this,&local_60,(QRegion *)&local_58,(RenderFlags)0x2);
    QRegion::~QRegion((QRegion *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

QPixmap QWidgetEffectSourcePrivate::pixmap(Qt::CoordinateSystem system, QPoint *offset,
                                           QGraphicsEffect::PixmapPadMode mode) const
{
    const bool deviceCoordinates = (system == Qt::DeviceCoordinates);
    if (Q_UNLIKELY(!context && deviceCoordinates)) {
        // Device coordinates without context not yet supported.
        qWarning("QGraphicsEffectSource::pixmap: Not yet implemented, lacking device context");
        return QPixmap();
    }

    QPoint pixmapOffset;
    QRectF sourceRect = m_widget->rect();

    if (deviceCoordinates) {
        const QTransform &painterTransform = context->painter->worldTransform();
        sourceRect = painterTransform.mapRect(sourceRect);
        pixmapOffset = painterTransform.map(pixmapOffset);
    }

    QRect effectRect;

    if (mode == QGraphicsEffect::PadToEffectiveBoundingRect)
        effectRect = m_widget->graphicsEffect()->boundingRectFor(sourceRect).toAlignedRect();
    else if (mode == QGraphicsEffect::PadToTransparentBorder)
        effectRect = sourceRect.adjusted(-1, -1, 1, 1).toAlignedRect();
    else
        effectRect = sourceRect.toAlignedRect();

    if (offset)
        *offset = effectRect.topLeft();

    pixmapOffset -= effectRect.topLeft();

    qreal dpr(1.0);
    if (const auto *paintDevice = context->painter->device())
        dpr = paintDevice->devicePixelRatio();
    else
        qWarning("QWidgetEffectSourcePrivate::pixmap: Painter not active");
    QPixmap pixmap(effectRect.size() * dpr);
    pixmap.setDevicePixelRatio(dpr);

    pixmap.fill(Qt::transparent);
    m_widget->render(&pixmap, pixmapOffset, QRegion(), QWidget::DrawChildren);
    return pixmap;
}